

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O1

xml_attribute<char> * __thiscall
rapidxml::xml_node<char>::first_attribute
          (xml_node<char> *this,char *name,size_t name_size,bool case_sensitive)

{
  byte *pbVar1;
  byte bVar2;
  long lVar3;
  size_t sVar4;
  xml_attribute<char> *pxVar5;
  byte *pbVar6;
  char *end;
  byte *pbVar7;
  bool bVar8;
  
  if (name == (char *)0x0) {
    pxVar5 = this->m_first_attribute;
  }
  else {
    if (name_size == 0) {
      sVar4 = 0xffffffffffffffff;
      do {
        name_size = sVar4 + 1;
        lVar3 = sVar4 + 1;
        sVar4 = name_size;
      } while (name[lVar3] != '\0');
    }
    pxVar5 = this->m_first_attribute;
    if (pxVar5 != (xml_attribute<char> *)0x0) {
      do {
        pbVar6 = (byte *)(pxVar5->super_xml_base<char>).m_name;
        if (pbVar6 == (byte *)0x0) {
          pbVar6 = &xml_base<char>::nullstr()::zero;
          sVar4 = 0;
        }
        else {
          sVar4 = (pxVar5->super_xml_base<char>).m_name_size;
        }
        if (sVar4 == name_size) {
          pbVar1 = pbVar6 + sVar4;
          bVar8 = 0 < (long)sVar4;
          if (case_sensitive) {
            if ((long)sVar4 < 1) {
              return pxVar5;
            }
            pbVar7 = (byte *)(name + 1);
            if (*pbVar6 == *name) {
              do {
                pbVar6 = pbVar6 + 1;
                bVar8 = pbVar6 < pbVar1;
                if (!bVar8) {
                  return pxVar5;
                }
                bVar2 = *pbVar7;
                pbVar7 = pbVar7 + 1;
              } while (*pbVar6 == bVar2);
            }
          }
          else {
            if ((long)sVar4 < 1) {
              return pxVar5;
            }
            pbVar7 = (byte *)(name + 1);
            if (internal::lookup_tables<0>::lookup_upcase[*pbVar6] ==
                internal::lookup_tables<0>::lookup_upcase[(byte)*name]) {
              do {
                pbVar6 = pbVar6 + 1;
                bVar8 = pbVar6 < pbVar1;
                if (!bVar8) {
                  return pxVar5;
                }
                bVar2 = *pbVar7;
                pbVar7 = pbVar7 + 1;
              } while (internal::lookup_tables<0>::lookup_upcase[*pbVar6] ==
                       internal::lookup_tables<0>::lookup_upcase[bVar2]);
            }
          }
          if (!bVar8) {
            return pxVar5;
          }
        }
        pxVar5 = pxVar5->m_next_attribute;
        if (pxVar5 == (xml_attribute<char> *)0x0) {
          return (xml_attribute<char> *)0x0;
        }
      } while( true );
    }
  }
  return pxVar5;
}

Assistant:

xml_attribute<Ch> *first_attribute(const Ch *name = 0, std::size_t name_size = 0, bool case_sensitive = true) const
        {
            if (name)
            {
                if (name_size == 0)
                    name_size = internal::measure(name);
                for (xml_attribute<Ch> *attribute = m_first_attribute; attribute; attribute = attribute->m_next_attribute)
                    if (internal::compare(attribute->name(), attribute->name_size(), name, name_size, case_sensitive))
                        return attribute;
                return 0;
            }
            else
                return m_first_attribute;
        }